

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileRead.cpp
# Opt level: O2

void __thiscall
stk::FileRead::FileRead
          (FileRead *this,string *fileName,bool typeRaw,uint nChannels,StkFormat format,
          StkFloat rate)

{
  string local_48 [32];
  
  Stk::Stk(&this->super_Stk);
  (this->super_Stk)._vptr_Stk = (_func_int **)&PTR__FileRead_00115cb8;
  this->fd_ = (FILE *)0x0;
  std::__cxx11::string::string(local_48,(string *)fileName);
  open(this,(char *)local_48,(uint)typeRaw,rate,(ulong)nChannels,format);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

FileRead :: FileRead( std::string fileName, bool typeRaw, unsigned int nChannels,
                      StkFormat format, StkFloat rate )
  : fd_(0)
{
  open( fileName, typeRaw, nChannels, format, rate );
}